

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::CPhase
          (CPhase<std::complex<float>_> *this,int control,int target,real_type cos,real_type sin,
          int controlState)

{
  int controlState_local;
  real_type sin_local;
  real_type cos_local;
  int target_local;
  int control_local;
  CPhase<std::complex<float>_> *this_local;
  
  controlState_local = (int)cos;
  sin_local = (real_type)target;
  cos_local = (real_type)control;
  _target_local = this;
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0014e5c0;
  std::make_unique<qclab::qgates::Phase<std::complex<float>>,int_const&,float_const&,float&>
            ((int *)&this->gate_,&sin_local,(float *)&controlState_local);
  if ((int)cos_local < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                  ,0x50,
                  "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const real_type, real_type, const int) [T = std::complex<float>]"
                 );
  }
  if (-1 < (int)sin_local) {
    if (cos_local != sin_local) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                  ,0x51,
                  "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const real_type, real_type, const int) [T = std::complex<float>]"
                 );
  }
  __assert_fail("target >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                ,0x50,
                "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const real_type, real_type, const int) [T = std::complex<float>]"
               );
}

Assistant:

CPhase( const int control , const int target ,
                const real_type cos , real_type sin ,
                const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< Phase< T > >( target , cos , sin ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }